

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_xar.c
# Opt level: O0

void file_free_register(xar_conflict *xar)

{
  file_conflict *pfVar1;
  file_conflict *file_next;
  file_conflict *file;
  xar_conflict *xar_local;
  
  file_next = (xar->file_list).first;
  while (file_next != (file_conflict *)0x0) {
    pfVar1 = file_next->next;
    file_free(file_next);
    file_next = pfVar1;
  }
  return;
}

Assistant:

static void
file_free_register(struct xar *xar)
{
	struct file *file, *file_next;

	file = xar->file_list.first;
	while (file != NULL) {
		file_next = file->next;
		file_free(file);
		file = file_next;
	}
}